

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O2

bool __thiscall
OpenMD::ForceFieldOptions::setData(ForceFieldOptions *this,string *keyword,string *value)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  string asStack_48 [32];
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    snprintf(painCave.errMsg,2000,"%s is an unrecognized keyword\n",(keyword->_M_dataplus)._M_p);
    painCave.isFatal = 0;
  }
  else {
    bVar2 = isInteger(value);
    if (bVar2) {
      iVar4 = lexi_cast<int>(value);
      cVar3 = (**(code **)(**(long **)(iVar5._M_node + 2) + 0x20))
                        (*(long **)(iVar5._M_node + 2),iVar4);
    }
    else {
      bVar2 = isType<double>(value);
      if (bVar2) {
        lexi_cast<double>(value);
        cVar3 = (**(code **)(**(long **)(iVar5._M_node + 2) + 0x30))();
      }
      else {
        plVar1 = *(long **)(iVar5._M_node + 2);
        std::__cxx11::string::string(asStack_48,(string *)value);
        cVar3 = (**(code **)(*plVar1 + 0x18))(plVar1,asStack_48);
        std::__cxx11::string::~string(asStack_48);
      }
    }
    if (cVar3 != '\0') {
      return true;
    }
    snprintf(painCave.errMsg,2000,"Unrecognized data type for keyword: %s = %s\n",
             (keyword->_M_dataplus)._M_p,(value->_M_dataplus)._M_p);
    painCave.isFatal = 1;
  }
  simError();
  return false;
}

Assistant:

bool setData(const std::string& keyword, const std::string& value) {
      bool result(false);
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        if (isInteger(value)) {
          int ival = lexi_cast<int>(value);
          result   = i->second->setData(ival);
        } else if (isType<RealType>(value)) {
          RealType dval = lexi_cast<RealType>(value);
          result        = i->second->setData(dval);
        } else {
          result = i->second->setData(value);
        }

        if (!result) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Unrecognized data type for keyword: %s = %s\n",
                   keyword.c_str(), value.c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s is an unrecognized keyword\n", keyword.c_str());
        painCave.isFatal = 0;
        simError();
      }

      return result;
    }